

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void check(double d)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _Alloc_hider _Var9;
  runtime_error *this;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ostream *poVar13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  int iVar20;
  byte *pbVar21;
  ulong uVar22;
  byte *pbVar23;
  byte *pbVar24;
  long lVar25;
  bool bVar26;
  double x;
  double local_50;
  string s;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct((ulong)&s,'@');
  snprintf(s._M_dataplus._M_p,s._M_string_length,"%.*e",d,0x10);
  std::__cxx11::string::resize((ulong)&s);
  bVar1 = *s._M_dataplus._M_p;
  _Var9 = s._M_dataplus;
  bVar15 = bVar1;
  if (bVar1 == 0x2d) {
    bVar15 = s._M_dataplus._M_p[1];
    if ((byte)(bVar15 - 0x30) < 10) {
      _Var9._M_p = s._M_dataplus._M_p + 1;
      goto LAB_001024ec;
    }
  }
  else {
LAB_001024ec:
    if (bVar15 == 0x30) {
      bVar19 = ((byte *)_Var9._M_p)[1];
      if (9 < (byte)(bVar19 - 0x30)) {
        pbVar23 = (byte *)_Var9._M_p + 1;
        uVar22 = 0;
LAB_00102509:
        if (bVar19 == 0x2e) {
          bVar16 = pbVar23[1] - 0x30;
          if (9 < bVar16) goto LAB_001026a9;
          pbVar21 = pbVar23 + 1;
          lVar25 = 0;
          pbVar23 = pbVar21;
          do {
            uVar22 = (ulong)bVar16 + uVar22 * 10;
            bVar19 = pbVar23[1];
            pbVar23 = pbVar23 + 1;
            bVar16 = bVar19 - 0x30;
            lVar25 = lVar25 + -1;
          } while (bVar16 < 10);
          iVar20 = (int)pbVar21 - (int)lVar25;
        }
        else {
          lVar25 = 0;
          iVar20 = (int)pbVar23;
        }
        if ((bVar19 | 0x20) == 0x65) {
          pbVar21 = pbVar23 + 1;
          bVar26 = (*pbVar21 - 0x2b & 0xfd) == 0;
          pbVar24 = pbVar23 + 1;
          if (bVar26) {
            pbVar24 = pbVar23 + 2;
          }
          bVar19 = pbVar23[(ulong)bVar26 + 1] - 0x30;
          if (9 < bVar19) goto LAB_001026a9;
          bVar16 = pbVar24[1] - 0x30;
          uVar12 = (ulong)bVar19 * 10 + (ulong)bVar16;
          if (9 < bVar16) {
            uVar12 = (ulong)bVar19;
          }
          pbVar23 = pbVar24 + 2;
          if (9 < bVar16) {
            pbVar23 = pbVar24 + 1;
          }
          bVar19 = pbVar24[(ulong)(bVar16 < 10) + 1] - 0x30;
          pbVar23 = pbVar23 + (bVar19 < 10);
          uVar11 = uVar12 * 10 + (ulong)bVar19;
          if (9 < bVar19) {
            uVar11 = uVar12;
          }
          for (; (byte)(*pbVar23 - 0x30) < 10; pbVar23 = pbVar23 + 1) {
            if ((long)uVar11 < 0x100000000) {
              uVar11 = (ulong)(byte)(*pbVar23 - 0x30) + uVar11 * 10;
            }
          }
          uVar12 = -uVar11;
          if (*pbVar21 != 0x2d) {
            uVar12 = uVar11;
          }
          lVar25 = lVar25 + uVar12;
        }
        if ((int)(~(uint)_Var9._M_p + iVar20) < 0x13) {
LAB_0010267c:
          if (lVar25 - 0x135U < 0xfffffffffffffd86) goto LAB_0010268b;
          if ((uVar22 >> 0x35 == 0) && (lVar25 + 0x16U < 0x2d)) {
            if (lVar25 < 0) {
              x = (double)(long)uVar22 /
                  *(double *)
                   (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                    power_of_ten + lVar25 * -8);
            }
            else {
              x = (double)(long)uVar22 *
                  *(double *)
                   (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                    power_of_ten + lVar25 * 8);
            }
            if (bVar1 == 0x2d) {
              x = -x;
            }
          }
          else {
            if (uVar22 != 0) {
              uVar12 = 0x3f;
              if (uVar22 != 0) {
                for (; uVar22 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar22 = uVar22 << ((byte)(uVar12 ^ 0x3f) & 0x3f);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar22;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64
                                       + lVar25 * 8 + 0xa28);
              auVar2 = auVar2 * auVar4;
              uVar10 = auVar2._0_8_;
              uVar11 = auVar2._8_8_ & 0x1ff;
              if ((uVar11 == 0x1ff) && (uVar11 = 0x1ff, CARRY8(uVar10,uVar22))) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar22;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                          compute_float_64(long,unsigned_long,bool,bool*)::
                                          mantissa_128 + lVar25 * 8 + 0xa28);
                uVar18 = SUB168(auVar3 * auVar5,8);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar18;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar18;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar18;
                auVar7 = auVar2 + auVar7;
                auVar6 = auVar2 + auVar6;
                uVar17 = auVar2._8_4_ + (uint)CARRY8(uVar10,uVar18) & 0x1ff;
                uVar11 = (ulong)uVar17;
                auVar2 = auVar2 + auVar8;
                if ((!CARRY8(SUB168(auVar3 * auVar5,0),uVar22)) ||
                   ((auVar2 = auVar6, uVar10 + uVar18 != -1 || (auVar2 = auVar7, uVar17 != 0x1ff))))
                goto LAB_00102752;
              }
              else {
LAB_00102752:
                uVar22 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
                uVar17 = (uint)uVar22;
                if ((auVar2._0_8_ != 0) || ((uVar11 != 0 || ((uVar17 & 3) != 1)))) {
                  uVar22 = (uVar17 & 1) + uVar22;
                  uVar11 = uVar22 >> 0x36;
                  uVar12 = ((lVar25 * 0x3526a >> 0x10) + 0x43f) -
                           ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar12 ^ 0x3f) + -1 + (ulong)(uVar11 == 0)
                           );
                  if ((uVar12 != 0) && (uVar12 < 0x7ff)) {
                    uVar10 = 0;
                    if (uVar11 == 0) {
                      uVar10 = uVar22 >> 1 & 0xefffffffffffff;
                    }
                    x = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar10 | uVar12 << 0x34);
                    goto LAB_00102833;
                  }
                }
              }
              x = 0.0;
              goto LAB_0010268b;
            }
            if (bVar1 == 0x2d) {
              x = -0.0;
            }
            else {
              x = 0.0;
            }
          }
        }
        else {
          lVar14 = 1;
          while ((bVar15 == 0x30 || (bVar15 == 0x2e))) {
            pbVar21 = (byte *)_Var9._M_p + lVar14;
            lVar14 = lVar14 + 1;
            bVar15 = *pbVar21;
          }
          if ((int)((iVar20 - (uint)_Var9._M_p) - (int)lVar14) < 0x13) goto LAB_0010267c;
LAB_0010268b:
          pbVar23 = (byte *)fast_double_parser::parse_float_strtod(s._M_dataplus._M_p,&x);
          if (pbVar23 == (byte *)0x0) goto LAB_001026a9;
        }
LAB_00102833:
        if (pbVar23 == (byte *)(s._M_dataplus._M_p + s._M_string_length)) {
          if ((x == d) && (!NAN(x) && !NAN(d))) {
            std::__cxx11::string::~string((string *)&s);
            return;
          }
          local_50 = x;
          poVar13 = std::operator<<((ostream *)&std::cerr,"fast_double_parser disagrees");
          std::endl<char,std::char_traits<char>>(poVar13);
          printf("fast_double_parser: %.*e\n",local_50,0x10);
          printf("reference: %.*e\n",d,0x10);
          printf("string: %s\n",s._M_dataplus._M_p);
          if ((long)((ulong)local_50 ^ (ulong)d) < 0) {
            lVar25 = (long)d + (long)local_50 + 0x80000000;
          }
          else {
            lVar14 = (long)local_50 - (long)d;
            lVar25 = -lVar14;
            if (0 < lVar14) {
              lVar25 = lVar14;
            }
          }
          printf("f64_ulp_dist = %d\n",lVar25);
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"fast_double_parser disagrees");
        }
        else {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"does not point at the end");
        }
        goto LAB_0010290f;
      }
    }
    else if ((byte)(bVar15 - 0x30) < 10) {
      uVar22 = (ulong)(byte)(bVar15 - 0x30);
      pbVar23 = (byte *)_Var9._M_p;
      while( true ) {
        pbVar23 = pbVar23 + 1;
        bVar19 = *pbVar23;
        if (9 < (byte)(bVar19 - 0x30)) break;
        uVar22 = (ulong)(byte)(bVar19 - 0x30) + uVar22 * 10;
      }
      goto LAB_00102509;
    }
  }
LAB_001026a9:
  printf("fast_double_parser refused to parse %s\n",s._M_dataplus._M_p);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"fast_double_parser refused to parse");
LAB_0010290f:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check(double d) {
  std::string s(64, '\0');
  auto written = std::snprintf(&s[0], s.size(), "%.*e", DBL_DIG + 1, d);
  s.resize(written);
  double x;
  const char * isok = fast_double_parser::parse_number(s.data(), &x);
  if (!isok) {
    printf("fast_double_parser refused to parse %s\n", s.c_str());
    throw std::runtime_error("fast_double_parser refused to parse");
  }
  if(isok != s.data() + s.size()) throw std::runtime_error("does not point at the end");
  if (d != x) {
    std::cerr << "fast_double_parser disagrees" << std::endl;
    printf("fast_double_parser: %.*e\n", DBL_DIG + 1, x);
    printf("reference: %.*e\n", DBL_DIG + 1, d);
    printf("string: %s\n", s.c_str());
    printf("f64_ulp_dist = %d\n", (int)f64_ulp_dist(x, d));
    throw std::runtime_error("fast_double_parser disagrees");
  }
}